

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28ebc5::ArgParser::parseOptions(ArgParser *this)

{
  runtime_error *e;
  ArgParser *this_local;
  
  QPDFArgParser::parseArgs(&this->ap);
  return;
}

Assistant:

void
ArgParser::parseOptions()
{
    try {
        this->ap.parseArgs();
    } catch (std::runtime_error& e) {
        usage(e.what());
    }
}